

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::FieldDescriptorProto::SerializeWithCachedSizesToArray
          (FieldDescriptorProto *this,uint8 *target)

{
  string *psVar1;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar2;
  char cVar3;
  uint uVar4;
  uint32 uVar5;
  uint8 *puVar6;
  FieldOptions *this_00;
  
  uVar4 = this->_has_bits_[0];
  if ((uVar4 & 1) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->name_->_M_dataplus)._M_p,(int)this->name_->_M_string_length,SERIALIZE);
    psVar1 = this->name_;
    *target = '\n';
    uVar5 = (uint32)psVar1->_M_string_length;
    if (uVar5 < 0x80) {
      target[1] = (uint8)psVar1->_M_string_length;
      puVar6 = target + 2;
    }
    else {
      puVar6 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar5,target + 1);
    }
    target = io::CodedOutputStream::WriteRawToArray
                       ((psVar1->_M_dataplus)._M_p,(int)psVar1->_M_string_length,puVar6);
    uVar4 = this->_has_bits_[0];
  }
  if ((uVar4 & 0x20) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->extendee_->_M_dataplus)._M_p,(int)this->extendee_->_M_string_length,SERIALIZE)
    ;
    psVar1 = this->extendee_;
    *target = '\x12';
    uVar5 = (uint32)psVar1->_M_string_length;
    if (uVar5 < 0x80) {
      target[1] = (uint8)psVar1->_M_string_length;
      puVar6 = target + 2;
    }
    else {
      puVar6 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar5,target + 1);
    }
    target = io::CodedOutputStream::WriteRawToArray
                       ((psVar1->_M_dataplus)._M_p,(int)psVar1->_M_string_length,puVar6);
    uVar4 = this->_has_bits_[0];
  }
  if ((uVar4 & 2) != 0) {
    uVar4 = this->number_;
    *target = '\x18';
    if ((long)(int)uVar4 < 0) {
      target = io::CodedOutputStream::WriteVarint64ToArray((long)(int)uVar4,target + 1);
    }
    else if (uVar4 < 0x80) {
      target[1] = (uint8)uVar4;
      target = target + 2;
    }
    else {
      target = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar4,target + 1);
    }
  }
  if ((this->_has_bits_[0] & 4) != 0) {
    uVar4 = this->label_;
    *target = ' ';
    if ((long)(int)uVar4 < 0) {
      target = io::CodedOutputStream::WriteVarint64ToArray((long)(int)uVar4,target + 1);
    }
    else if (uVar4 < 0x80) {
      target[1] = (uint8)uVar4;
      target = target + 2;
    }
    else {
      target = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar4,target + 1);
    }
  }
  if ((this->_has_bits_[0] & 8) != 0) {
    uVar4 = this->type_;
    *target = '(';
    if ((long)(int)uVar4 < 0) {
      target = io::CodedOutputStream::WriteVarint64ToArray((long)(int)uVar4,target + 1);
    }
    else if (uVar4 < 0x80) {
      target[1] = (uint8)uVar4;
      target = target + 2;
    }
    else {
      target = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar4,target + 1);
    }
  }
  uVar4 = this->_has_bits_[0];
  if ((uVar4 & 0x10) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->type_name_->_M_dataplus)._M_p,(int)this->type_name_->_M_string_length,
               SERIALIZE);
    psVar1 = this->type_name_;
    *target = '2';
    uVar5 = (uint32)psVar1->_M_string_length;
    if (uVar5 < 0x80) {
      target[1] = (uint8)psVar1->_M_string_length;
      puVar6 = target + 2;
    }
    else {
      puVar6 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar5,target + 1);
    }
    target = io::CodedOutputStream::WriteRawToArray
                       ((psVar1->_M_dataplus)._M_p,(int)psVar1->_M_string_length,puVar6);
    uVar4 = this->_has_bits_[0];
  }
  cVar3 = (char)uVar4;
  if ((uVar4 & 0x40) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->default_value_->_M_dataplus)._M_p,(int)this->default_value_->_M_string_length,
               SERIALIZE);
    psVar1 = this->default_value_;
    *target = ':';
    uVar5 = (uint32)psVar1->_M_string_length;
    if (uVar5 < 0x80) {
      target[1] = (uint8)psVar1->_M_string_length;
      puVar6 = target + 2;
    }
    else {
      puVar6 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar5,target + 1);
    }
    target = io::CodedOutputStream::WriteRawToArray
                       ((psVar1->_M_dataplus)._M_p,(int)psVar1->_M_string_length,puVar6);
    cVar3 = (char)this->_has_bits_[0];
  }
  if (cVar3 < '\0') {
    this_00 = this->options_;
    if (this_00 == (FieldOptions *)0x0) {
      this_00 = *(FieldOptions **)(default_instance_ + 0x38);
    }
    *target = 'B';
    uVar4 = this_00->_cached_size_;
    if (uVar4 < 0x80) {
      target[1] = (uint8)uVar4;
      puVar6 = target + 2;
    }
    else {
      puVar6 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar4,target + 1);
    }
    target = FieldOptions::SerializeWithCachedSizesToArray(this_00,puVar6);
  }
  pvVar2 = (this->_unknown_fields_).fields_;
  if ((pvVar2 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    puVar6 = internal::WireFormat::SerializeUnknownFieldsToArray(&this->_unknown_fields_,target);
    return puVar6;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* FieldDescriptorProto::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // optional string name = 1;
  if (has_name()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // optional string extendee = 2;
  if (has_extendee()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->extendee().data(), this->extendee().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        2, this->extendee(), target);
  }

  // optional int32 number = 3;
  if (has_number()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(3, this->number(), target);
  }

  // optional .google.protobuf.FieldDescriptorProto.Label label = 4;
  if (has_label()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      4, this->label(), target);
  }

  // optional .google.protobuf.FieldDescriptorProto.Type type = 5;
  if (has_type()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      5, this->type(), target);
  }

  // optional string type_name = 6;
  if (has_type_name()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->type_name().data(), this->type_name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        6, this->type_name(), target);
  }

  // optional string default_value = 7;
  if (has_default_value()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->default_value().data(), this->default_value().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        7, this->default_value(), target);
  }

  // optional .google.protobuf.FieldOptions options = 8;
  if (has_options()) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        8, this->options(), target);
  }

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}